

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 uVar1;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> m;
  long lVar2;
  raw_ostream *prVar3;
  int iVar4;
  StringRef SVar5;
  allocator local_551;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  MemorySSADumper dumper;
  TimeMeasure local_510;
  LLVMDataDependenceAnalysis DDA;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  LLVMPointerAnalysisOptions local_138;
  LLVMDataDependenceAnalysisOptions local_c8;
  
  setupStackTraceOnError(argc,argv);
  iVar4 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-dda-dump",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) goto LAB_00118c3e;
  SVar5.Length = (size_t)options.dgOptions.entryFunction._M_dataplus._M_p;
  SVar5.Data = (char *)M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl;
  lVar2 = llvm::Module::getFunction(SVar5);
  m = M;
  if (lVar2 == 0) {
    prVar3 = (raw_ostream *)llvm::errs();
    prVar3 = llvm::raw_ostream::operator<<(prVar3,"The entry function not found: ");
    prVar3 = llvm::raw_ostream::operator<<(prVar3,&options.dgOptions.entryFunction);
    llvm::raw_ostream::operator<<(prVar3,"\n");
    goto LAB_00118c3e;
  }
  dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
            (&local_138,(LLVMPointerAnalysisOptions *)&options);
  dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
            (&PTA,(Module *)
                  m._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                  _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                  super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_138);
  dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_138);
  local_510.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  dg::DGLLVMPointerAnalysis::run(&PTA);
  local_510.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::__cxx11::string::string((string *)&DDA,"INFO: Pointer analysis took",(allocator *)&dumper);
  dg::debug::TimeMeasure::report(&local_510,(string *)&DDA,(ostream *)&std::cerr);
  std::__cxx11::string::_M_dispose();
  local_510.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  dg::LLVMDataDependenceAnalysisOptions::LLVMDataDependenceAnalysisOptions
            (&local_c8,&options.dgOptions.DDAOptions);
  dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
            (&DDA,(Module *)
                  M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                  _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                  super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
             &PTA.super_LLVMPointerAnalysis,&local_c8);
  dg::LLVMDataDependenceAnalysisOptions::~LLVMDataDependenceAnalysisOptions(&local_c8);
  if (graph_only[0x80] == '\x01') {
    dg::dda::LLVMDataDependenceAnalysis::buildGraph(&DDA);
  }
  else {
    dg::dda::LLVMDataDependenceAnalysis::run(&DDA);
  }
  local_510.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::__cxx11::string::string((string *)&dumper,"INFO: Data dependence analysis took",&local_551);
  dg::debug::TimeMeasure::report(&local_510,(string *)&dumper,(ostream *)&std::cerr);
  std::__cxx11::string::_M_dispose();
  if (dump_c_lines[0x80] == '\x01') {
    allocasToVars((Module *)&dumper);
    std::
    _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
    ::_M_move_assign(&valuesToVars._M_t,(Module *)&dumper);
    std::
    _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
    ::~_Rb_tree((_Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                 *)&dumper);
    if (valuesToVars._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      prVar3 = (raw_ostream *)llvm::errs();
      prVar3 = llvm::raw_ostream::operator<<(prVar3,"WARNING: No debugging information found, ");
      llvm::raw_ostream::operator<<(prVar3,"the C lines output will be corrupted\n");
    }
  }
  uVar1 = todot[0x80];
  if (DDA._options.super_DataDependenceAnalysisOptions.analysisType == ssa) {
    if (graph_only[0x80] == '\0') {
      dg::dda::MemorySSATransformation::computeAllDefinitions();
    }
    if (quiet[0x80] == '\0') {
      dumper.super_Dumper._vptr_Dumper = (_func_int **)&PTR_dumpBBlockDefinitions_00128c40;
      goto LAB_00118c20;
    }
  }
  else {
    dumper.super_Dumper._vptr_Dumper = (_func_int **)&PTR_dumpBBlockDefinitions_00128c60;
LAB_00118c20:
    dumper.super_Dumper.dot = (bool)uVar1;
    dumper.super_Dumper.DDA = &DDA;
    Dumper::dump(&dumper.super_Dumper);
  }
  dg::dda::LLVMDataDependenceAnalysis::~LLVMDataDependenceAnalysis(&DDA);
  dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis(&PTA);
  iVar4 = 0;
LAB_00118c3e:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-dda-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    debug::TimeMeasure tm;

    DGLLVMPointerAnalysis PTA(M.get(), options.dgOptions.PTAOptions);

    tm.start();
    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    tm.start();
    LLVMDataDependenceAnalysis DDA(M.get(), &PTA, options.dgOptions.DDAOptions);
    if (graph_only) {
        DDA.buildGraph();
    } else {
        DDA.run();
    }
    tm.stop();
    tm.report("INFO: Data dependence analysis took");

    if (dump_c_lines) {
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        llvm::errs() << "WARNING: Variables names matching is not supported "
                        "for LLVM older than 3.7\n";
#else
        valuesToVars = allocasToVars(*M);
#endif // LLVM > 3.6
        if (valuesToVars.empty()) {
            llvm::errs() << "WARNING: No debugging information found, "
                         << "the C lines output will be corrupted\n";
        }
    }

    dumpDefs(&DDA, todot);

    return 0;
}